

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBJMeshFileLoader.cpp
# Opt level: O0

SObjMtl * __thiscall
irr::scene::COBJMeshFileLoader::findMtl(COBJMeshFileLoader *this,stringc *mtlName,stringc *grpName)

{
  bool bVar1;
  u32 uVar2;
  SObjMtl **ppSVar3;
  SObjMtl *o;
  array<irr::scene::COBJMeshFileLoader::SObjMtl_*> *this_00;
  long in_RDI;
  u32 i;
  SObjMtl *defMaterial;
  undefined4 in_stack_ffffffffffffff78;
  u32 in_stack_ffffffffffffff7c;
  array<irr::scene::COBJMeshFileLoader::SObjMtl_*> *in_stack_ffffffffffffff80;
  SObjMtl *in_stack_ffffffffffffff88;
  SObjMtl *in_stack_ffffffffffffff90;
  uint local_2c;
  SObjMtl *local_28;
  SObjMtl *local_8;
  
  local_28 = (SObjMtl *)0x0;
  local_2c = 0;
  do {
    uVar2 = core::array<irr::scene::COBJMeshFileLoader::SObjMtl_*>::size
                      ((array<irr::scene::COBJMeshFileLoader::SObjMtl_*> *)0x2d9c67);
    if (uVar2 <= local_2c) {
      if (local_28 == (SObjMtl *)0x0) {
        uVar2 = core::string<char>::size((string<char> *)0x2d9db7);
        if (uVar2 == 0) {
          local_8 = (SObjMtl *)0x0;
        }
        else {
          o = (SObjMtl *)(in_RDI + 0x10);
          this_00 = (array<irr::scene::COBJMeshFileLoader::SObjMtl_*> *)operator_new(0x80);
          core::array<irr::scene::COBJMeshFileLoader::SObjMtl_*>::operator[]
                    (this_00,in_stack_ffffffffffffff7c);
          SObjMtl::SObjMtl(in_stack_ffffffffffffff90,o);
          core::array<irr::scene::COBJMeshFileLoader::SObjMtl_*>::push_back
                    (this_00,(SObjMtl **)
                             CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
          core::array<irr::scene::COBJMeshFileLoader::SObjMtl_*>::getLast
                    ((array<irr::scene::COBJMeshFileLoader::SObjMtl_*> *)0x2d9e2b);
          core::string<char>::operator=((string<char> *)o,(string<char> *)this_00);
          ppSVar3 = core::array<irr::scene::COBJMeshFileLoader::SObjMtl_*>::getLast
                              ((array<irr::scene::COBJMeshFileLoader::SObjMtl_*> *)0x2d9e4a);
          local_8 = *ppSVar3;
        }
      }
      else {
        operator_new(0x80);
        SObjMtl::SObjMtl(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
        core::array<irr::scene::COBJMeshFileLoader::SObjMtl_*>::push_back
                  (in_stack_ffffffffffffff80,
                   (SObjMtl **)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
        core::array<irr::scene::COBJMeshFileLoader::SObjMtl_*>::getLast
                  ((array<irr::scene::COBJMeshFileLoader::SObjMtl_*> *)0x2d9d7e);
        core::string<char>::operator=
                  ((string<char> *)in_stack_ffffffffffffff88,
                   (string<char> *)in_stack_ffffffffffffff80);
        ppSVar3 = core::array<irr::scene::COBJMeshFileLoader::SObjMtl_*>::getLast
                            ((array<irr::scene::COBJMeshFileLoader::SObjMtl_*> *)0x2d9d9d);
        local_8 = *ppSVar3;
      }
      return local_8;
    }
    core::array<irr::scene::COBJMeshFileLoader::SObjMtl_*>::operator[]
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
    bVar1 = core::string<char>::operator==
                      ((string<char> *)in_stack_ffffffffffffff80,
                       (string<char> *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)
                      );
    if (bVar1) {
      core::array<irr::scene::COBJMeshFileLoader::SObjMtl_*>::operator[]
                (in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
      bVar1 = core::string<char>::operator==
                        ((string<char> *)in_stack_ffffffffffffff80,
                         (string<char> *)
                         CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      if (bVar1) {
        ppSVar3 = core::array<irr::scene::COBJMeshFileLoader::SObjMtl_*>::operator[]
                            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
        return *ppSVar3;
      }
      ppSVar3 = core::array<irr::scene::COBJMeshFileLoader::SObjMtl_*>::operator[]
                          (in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
      local_28 = *ppSVar3;
    }
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

COBJMeshFileLoader::SObjMtl *COBJMeshFileLoader::findMtl(const core::stringc &mtlName, const core::stringc &grpName)
{
	COBJMeshFileLoader::SObjMtl *defMaterial = 0;
	// search existing Materials for best match
	// exact match does return immediately, only name match means a new group
	for (u32 i = 0; i < Materials.size(); ++i) {
		if (Materials[i]->Name == mtlName) {
			if (Materials[i]->Group == grpName)
				return Materials[i];
			else
				defMaterial = Materials[i];
		}
	}
	// we found a partial match
	if (defMaterial) {
		Materials.push_back(new SObjMtl(*defMaterial));
		Materials.getLast()->Group = grpName;
		return Materials.getLast();
	}
	// we found a new group for a non-existent material
	else if (grpName.size()) {
		Materials.push_back(new SObjMtl(*Materials[0]));
		Materials.getLast()->Group = grpName;
		return Materials.getLast();
	}
	return 0;
}